

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

void __thiscall crnlib::qdxt1::pack_endpoints_task(qdxt1 *this,uint64 data,void *param_2)

{
  spinlock *this_00;
  cluster_hash *this_01;
  color_quad_u8 *e1;
  vector<unsigned_int> *pvVar1;
  dxt_pixel_block *pdVar2;
  dxt1_block *pdVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  crn_thread_id_t cVar10;
  uchar *puVar11;
  uint block_iter_1;
  uint uVar12;
  color_quad<unsigned_char,_int> *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int i;
  uint uVar19;
  int i_1;
  uint uVar20;
  ulong uVar21;
  uint high_color;
  uint low_color;
  uint local_ae4;
  qdxt1 *local_ae0;
  cluster_id cid;
  uint local_a9c;
  vector<crnlib::color_quad<unsigned_char,_int>_> cluster_pixels;
  vector<unsigned_char> selectors;
  scoped_spinlock lock_1;
  scoped_spinlock lock;
  color_quad_u8 local_a60;
  color_quad_u8 local_a5c [3];
  uint64 local_a50;
  ulong local_a48;
  ulong local_a40;
  ulong local_a38;
  ulong local_a30;
  dxt1_block *local_a28;
  dxt_pixel_block *local_a20;
  results r;
  params local_9f8;
  dxt1_endpoint_optimizer optimizer;
  
  cluster_pixels.m_p = (color_quad<unsigned_char,_int> *)0x0;
  cluster_pixels.m_size = 0;
  cluster_pixels.m_capacity = 0;
  local_a50 = data;
  vector<crnlib::color_quad<unsigned_char,_int>_>::reserve(&cluster_pixels,0x400);
  selectors.m_p = (uchar *)0x0;
  selectors.m_size = 0;
  selectors.m_capacity = 0;
  vector<unsigned_char>::reserve(&selectors,0x400);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&optimizer);
  local_9f8.m_block_index = 0;
  local_9f8.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  local_9f8.m_num_pixels = 0;
  local_9f8.m_pixels_have_alpha = false;
  r.m_pSelectors = (uint8 *)0x0;
  local_9f8.m_grayscale_sampling = false;
  local_9f8.m_endpoint_caching = true;
  local_9f8.m_use_transparent_indices_for_black = false;
  local_9f8.m_force_alpha_blocks = false;
  local_9f8.m_quality = (this->m_params).m_dxt_quality;
  local_9f8.m_use_alpha_blocks = (this->m_params).m_use_alpha_blocks;
  local_9f8.m_dxt1a_alpha_threshold = (this->m_params).m_dxt1a_alpha_threshold;
  local_9f8.m_perceptual = (this->m_params).m_perceptual;
  uVar21 = 0;
  uVar5 = math::next_pow2((this->m_endpoint_cluster_indices).m_size / 100);
  uVar12 = 8;
  if (8 < uVar5 >> 1) {
    uVar12 = uVar5 >> 1;
  }
  cid.m_cells.m_p = (uint *)0x0;
  cid.m_cells.m_size = 0;
  cid.m_cells.m_capacity = 0;
  cid.m_hash = 0;
  this_00 = &this->m_cluster_hash_lock;
  this_01 = &this->m_cluster_hash;
  local_ae0 = this;
  while (((uVar21 < (this->m_endpoint_cluster_indices).m_size && (this->m_canceled == false)) &&
         ((uVar19 = (uint)uVar21, (uVar12 - 1 & uVar19) != 0 ||
          ((cVar10 = crn_get_current_thread_id(), cVar10 != this->m_main_thread_id ||
           (bVar4 = update_progress(this,uVar19,(this->m_endpoint_cluster_indices).m_size - 1),
           bVar4))))))) {
    uVar7 = this->m_pTask_pool->m_num_threads;
    if ((uVar7 == 0) || ((int)((uVar21 & 0xffffffff) % (ulong)(uVar7 + 1)) == (int)local_a50)) {
      pvVar1 = (this->m_endpoint_cluster_indices).m_p;
      vector<unsigned_char>::resize(&selectors,pvVar1[uVar21].m_size << 4,false);
      cluster_id::set(&cid,pvVar1 + uVar21);
      this = local_ae0;
      lock.m_lock = this_00;
      spinlock::lock(this_00);
      uVar6 = hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
              ::find_index(this_01,&cid);
      uVar7 = (this->m_cluster_hash).m_values.m_size;
      uVar15 = 0;
      if (uVar6 != uVar7) {
        uVar15 = (ulong)*(uint *)((this_01->m_values).m_p[uVar6].m_bits + 0x18);
      }
      scoped_spinlock::~scoped_spinlock(&lock);
      if (uVar6 == uVar7) {
        vector<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (&cluster_pixels,cid.m_cells.m_size << 4,false);
        bVar4 = false;
        pcVar13 = cluster_pixels.m_p;
        for (uVar15 = 0; uVar15 < (cid.m_cells._8_8_ & 0xffffffff); uVar15 = uVar15 + 1) {
          uVar16 = cid.m_cells.m_p[uVar15];
          pdVar2 = this->m_pBlocks;
          for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 4) {
            if ((uint)pdVar2[uVar16].m_pixels[0][0].field_0.c[lVar17 + 3] <
                (this->m_params).m_dxt1a_alpha_threshold) {
              bVar4 = true;
            }
            (pcVar13->field_0).c[lVar17] = pdVar2[uVar16].m_pixels[0][0].field_0.c[lVar17];
            (pcVar13->field_0).c[lVar17 + 1] = pdVar2[uVar16].m_pixels[0][0].field_0.c[lVar17 + 1];
            (pcVar13->field_0).c[lVar17 + 2] = pdVar2[uVar16].m_pixels[0][0].field_0.c[lVar17 + 2];
            (pcVar13->field_0).c[lVar17 + 3] = pdVar2[uVar16].m_pixels[0][0].field_0.c[lVar17 + 3];
          }
          pcVar13 = pcVar13 + 0x10;
        }
        local_9f8.m_num_pixels = cluster_pixels.m_size;
        local_9f8.m_pPixels = cluster_pixels.m_p;
        r.m_pSelectors = selectors.m_p;
        local_9f8.m_block_index = uVar19;
        if (((this->m_params).m_dxt_quality != cCRNDXTQualitySuperFast) || (bVar4)) {
          local_9f8.m_pixels_have_alpha = bVar4;
          dxt1_endpoint_optimizer::compute(&optimizer,&local_9f8,&r);
          low_color = (uint)r.m_low_color;
          high_color = (uint)r.m_high_color;
        }
        else {
          dxt_fast::compress_color_block
                    (cluster_pixels.m_size,cluster_pixels.m_p,&low_color,&high_color,selectors.m_p,
                     true);
        }
        puVar11 = selectors.m_p;
        for (uVar15 = 0; uVar15 < (cid.m_cells._8_8_ & 0xffffffff); uVar15 = uVar15 + 1) {
          pdVar3 = this->m_pDst_elements;
          uVar16 = this->m_elements_per_block * cid.m_cells.m_p[uVar15];
          *(undefined2 *)pdVar3[uVar16].m_low_color = (undefined2)low_color;
          *(undefined2 *)pdVar3[uVar16].m_high_color = (undefined2)high_color;
          uVar18 = 0;
          for (uVar19 = 0xf; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
            uVar18 = uVar18 << 2 | (uint)puVar11[uVar19];
          }
          puVar11 = puVar11 + 0x10;
          *(uint *)pdVar3[uVar16].m_selectors = uVar18;
        }
        lock_1.m_lock = this_00;
        spinlock::lock(this_00);
        local_a9c = high_color << 0x10 | low_color;
        hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
        ::insert((insert_result *)&lock,this_01,&cid,&local_a9c);
        scoped_spinlock::~scoped_spinlock(&lock_1);
      }
      else {
        local_ae4 = (uint)(uVar15 >> 0x10);
        dxt1_block::get_block_colors((color_quad_u8 *)&lock,(uint16)uVar15,(uint16)(uVar15 >> 0x10))
        ;
        uVar14 = 0;
        local_a48 = uVar21;
        while (uVar14 < (cid.m_cells._8_8_ & 0xffffffff)) {
          local_a38 = (ulong)cid.m_cells.m_p[uVar14];
          local_a20 = this->m_pBlocks + local_a38;
          local_a40 = uVar14;
          for (iVar9 = 0; iVar9 != 0x10; iVar9 = iVar9 + 1) {
            local_a28 = this->m_pDst_elements;
            local_a30 = (ulong)(this->m_elements_per_block * (int)local_a38);
            local_a28[local_a30].m_low_color[0] = (uint8)uVar15;
            local_a28[local_a30].m_low_color[1] = (uint8)(uVar15 >> 8);
            local_a28[local_a30].m_high_color[0] = (uint8)local_ae4;
            local_a28[local_a30].m_high_color[1] = (uint8)(uVar15 >> 0x18);
            uVar16 = 0;
            for (uVar19 = 0xf; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
              e1 = local_a20->m_pixels[0] + uVar19;
              uVar7 = crnlib::color::color_distance
                                ((this->m_params).m_perceptual,e1,(color_quad_u8 *)&lock,false);
              uVar6 = crnlib::color::color_distance
                                ((this->m_params).m_perceptual,e1,
                                 (color_quad_u8 *)((long)&lock.m_lock + 4),false);
              uVar8 = crnlib::color::color_distance
                                ((this->m_params).m_perceptual,e1,&local_a60,false);
              uVar18 = uVar7;
              if (uVar6 < uVar7) {
                uVar18 = uVar6;
              }
              uVar20 = (uint)(uVar6 < uVar7);
              if (uVar8 < uVar18) {
                uVar20 = 2;
                uVar18 = uVar8;
              }
              if (local_ae4 < ((uint)uVar15 & 0xffff)) {
                uVar7 = crnlib::color::color_distance
                                  ((local_ae0->m_params).m_perceptual,e1,local_a5c,false);
                bVar4 = uVar7 < uVar18;
              }
              else {
                bVar4 = (uint)(e1->field_0).field_0.a <
                        (local_ae0->m_params).m_dxt1a_alpha_threshold;
              }
              uVar18 = 3;
              if (!bVar4) {
                uVar18 = uVar20;
              }
              uVar16 = uVar16 << 2 | uVar18;
              this = local_ae0;
            }
            *(uint *)local_a28[local_a30].m_selectors = uVar16;
            uVar21 = local_a48;
          }
          uVar14 = local_a40 + 1;
        }
      }
    }
    uVar21 = uVar21 + 1;
  }
  vector<unsigned_int>::~vector(&cid.m_cells);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&optimizer);
  vector<unsigned_char>::~vector(&selectors);
  vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&cluster_pixels);
  return;
}

Assistant:

void qdxt1::pack_endpoints_task(uint64 data, void*)
    {
        const uint thread_index = static_cast<uint>(data);

        crnlib::vector<color_quad_u8> cluster_pixels;
        cluster_pixels.reserve(1024);

        crnlib::vector<uint8> selectors;
        selectors.reserve(1024);

        dxt1_endpoint_optimizer optimizer;
        dxt1_endpoint_optimizer::params p;
        dxt1_endpoint_optimizer::results r;

        p.m_quality = m_params.m_dxt_quality;
        p.m_use_alpha_blocks = m_params.m_use_alpha_blocks;
        p.m_dxt1a_alpha_threshold = m_params.m_dxt1a_alpha_threshold;
        p.m_perceptual = m_params.m_perceptual;

        uint cluster_index_progress_mask = math::next_pow2(m_endpoint_cluster_indices.size() / 100);
        cluster_index_progress_mask /= 2;
        cluster_index_progress_mask = math::maximum<uint>(cluster_index_progress_mask, 8);
        cluster_index_progress_mask -= 1;

        cluster_id cid;
        const crnlib::vector<uint32>& indices = cid.m_cells;

        for (uint cluster_index = 0; cluster_index < m_endpoint_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & cluster_index_progress_mask) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, m_endpoint_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& cluster_indices = m_endpoint_cluster_indices[cluster_index];

            selectors.resize(cluster_indices.size() * cDXTBlockSize * cDXTBlockSize);

            bool found = false;
            uint32 found_endpoints = 0;

            cid.set(cluster_indices);

            {
                scoped_spinlock lock(m_cluster_hash_lock);

                cluster_hash::const_iterator it(m_cluster_hash.find(cid));
                if (it != m_cluster_hash.end())
                {
                    CRNLIB_ASSERT(cid == it->first);

                    found = true;
                    found_endpoints = it->second;
                }
            }

            if (found)
            {
                const uint16 low_color = static_cast<uint16>(found_endpoints);
                const uint16 high_color = static_cast<uint16>((found_endpoints >> 16U));

                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors(block_colors, low_color, high_color);

                const bool is_alpha_block = (low_color <= high_color);

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        dxt1_block& dxt_block = get_block(block_index);

                        dxt_block.set_low_color(static_cast<uint16>(low_color));
                        dxt_block.set_high_color(static_cast<uint16>(high_color));

                        uint mask = 0;
                        for (int i = 15; i >= 0; i--)
                        {
                            mask <<= 2;

                            const color_quad_u8& c = pSrc_pixels[i];

                            uint dist0 = color::color_distance(m_params.m_perceptual, c, block_colors[0], false);
                            uint dist1 = color::color_distance(m_params.m_perceptual, c, block_colors[1], false);
                            uint dist2 = color::color_distance(m_params.m_perceptual, c, block_colors[2], false);

                            uint selector = 0, best_dist = dist0;

                            if (dist1 < best_dist)
                            {
                                selector = 1;
                                best_dist = dist1;
                            }
                            if (dist2 < best_dist)
                            {
                                selector = 2;
                                best_dist = dist2;
                            }

                            if (!is_alpha_block)
                            {
                                uint dist3 = color::color_distance(m_params.m_perceptual, c, block_colors[3], false);
                                if (dist3 < best_dist)
                                {
                                    selector = 3;
                                }
                            }
                            else
                            {
                                if (c.a < m_params.m_dxt1a_alpha_threshold)
                                {
                                    selector = 3;
                                }
                            }

                            mask |= selector;
                        }

                        dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                        dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                        dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                        dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                    }
                }
            }
            else
            {
                cluster_pixels.resize(indices.size() * cDXTBlockSize * cDXTBlockSize);

                color_quad_u8* pDst = &cluster_pixels[0];

                bool has_alpha_pixels = false;

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    //const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];
                    const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        const color_quad_u8& src = pSrc_pixels[i];

                        if (src.a < m_params.m_dxt1a_alpha_threshold)
                        {
                            has_alpha_pixels = true;
                        }

                        *pDst++ = src;
                    }
                }

                p.m_block_index = cluster_index;
                p.m_num_pixels = cluster_pixels.size();
                p.m_pPixels = cluster_pixels.begin();

                r.m_pSelectors = selectors.begin();

                uint low_color, high_color;
                if ((m_params.m_dxt_quality != cCRNDXTQualitySuperFast) || (has_alpha_pixels))
                {
                    p.m_pixels_have_alpha = has_alpha_pixels;

                    optimizer.compute(p, r);
                    low_color = r.m_low_color;
                    high_color = r.m_high_color;
                }
                else
                {
                    dxt_fast::compress_color_block(cluster_pixels.size(), cluster_pixels.begin(), low_color, high_color, selectors.begin(), true);
                }

                const uint8* pSrc_selectors = selectors.begin();

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    dxt1_block& dxt_block = get_block(block_index);

                    dxt_block.set_low_color(static_cast<uint16>(low_color));
                    dxt_block.set_high_color(static_cast<uint16>(high_color));

                    uint mask = 0;
                    for (int i = 15; i >= 0; i--)
                    {
                        mask <<= 2;
                        mask |= pSrc_selectors[i];
                    }
                    pSrc_selectors += (cDXTBlockSize * cDXTBlockSize);

                    dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                    dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                    dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                    dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                }

                {
                    scoped_spinlock lock(m_cluster_hash_lock);

                    m_cluster_hash.insert(cid, low_color | (high_color << 16));
                }
            }
        }
    }